

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O3

int testJSONHelpers(int param_1,char **param_2)

{
  _Base_ptr p_Var1;
  char *pcVar2;
  _Invoker_type p_Var3;
  void *pvVar4;
  size_t *psVar5;
  undefined4 uVar6;
  bool bVar7;
  int iVar8;
  ErrorCode EVar9;
  ostream *poVar10;
  Object<(anonymous_namespace)::ObjectStruct> *this;
  Value *pVVar11;
  pointer pMVar12;
  undefined8 uVar13;
  void *pvVar14;
  _Any_data *p_Var15;
  _Base_ptr *pp_Var16;
  code *pcVar17;
  _func_void *p_Var18;
  _Any_data *p_Var19;
  undefined1 required;
  undefined8 in_R8;
  ValueHolder VVar20;
  size_t *psVar21;
  long lVar22;
  int i;
  Object<(anonymous_namespace)::ObjectStruct> helper;
  Value v;
  ObjectStruct s5;
  ObjectStruct s4;
  ObjectStruct s1;
  ObjectStruct s7;
  ObjectStruct s6;
  ObjectStruct s2;
  InheritedStruct s4_1;
  ObjectStruct s3;
  _Any_data local_368;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_358;
  undefined4 uStack_348;
  undefined1 local_344;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_340;
  undefined8 local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  ValueHolder local_318;
  undefined1 uStack_310;
  undefined7 uStack_30f;
  undefined1 uStack_308;
  undefined7 uStack_307;
  uint uStack_300;
  undefined4 uStack_2fc;
  undefined4 uStack_2f8;
  undefined1 local_2f4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f0;
  undefined8 local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  _Any_data local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  undefined8 local_2a8;
  _Alloc_hider local_2a0;
  undefined8 local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  ValueHolder local_280;
  undefined8 local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  undefined1 local_258 [48];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  int local_208;
  _Alloc_hider local_200;
  size_type local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  _Any_data local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  _Any_data local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Any_data local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  undefined1 local_168 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_140;
  size_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  ValueHolder local_120;
  char *local_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  undefined8 local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  InheritedStruct local_d8;
  _Any_data local_90;
  code *local_80;
  _Any_data local_70;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  
  p_Var19 = &local_368;
  Json::Value::Value((Value *)&local_2c8,2);
  local_368._M_unused._M_member_pointer = (ulong)(uint)local_368._4_4_ << 0x20;
  local_318.string_ = (char *)&local_2c8;
  if ((anonymous_namespace)::IntHelper._16_8_ == 0) goto LAB_00175285;
  iVar8 = (*(code *)(anonymous_namespace)::IntHelper._24_8_)
                    ((anonymous_namespace)::IntHelper,&local_368,&local_318);
  if (iVar8 == 0) {
    if (local_368._0_4_ == 2) {
      local_368._M_unused._M_member_pointer =
           local_368._M_unused._M_member_pointer & 0xffffffff00000000;
      Json::Value::Value((Value *)&local_318,nullValue);
      Json::Value::operator=((Value *)&local_2c8,(Value *)&local_318);
      Json::Value::~Value((Value *)&local_318);
      local_318.string_ = (char *)&local_2c8;
      if ((anonymous_namespace)::IntHelper._16_8_ == 0) {
LAB_00175285:
        std::__throw_bad_function_call();
      }
      iVar8 = (*(code *)(anonymous_namespace)::IntHelper._24_8_)
                        ((anonymous_namespace)::IntHelper,&local_368,&local_318);
      if (iVar8 != 1) {
        iVar8 = 0x53;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "ASSERT_TRUE(IntHelper(i, &v) == ErrorCode::InvalidInt) failed on line ",0x46);
        goto LAB_00174e19;
      }
      local_368._M_unused._M_member_pointer =
           local_368._M_unused._M_member_pointer & 0xffffffff00000000;
      local_318.int_ = 0;
      if ((anonymous_namespace)::IntHelper._16_8_ == 0) goto LAB_00175285;
      iVar8 = (*(code *)(anonymous_namespace)::IntHelper._24_8_)
                        ((anonymous_namespace)::IntHelper,&local_368,&local_318);
      if (iVar8 == 0) {
        if (local_368._0_4_ == 1) {
          Json::Value::~Value((Value *)&local_2c8);
          Json::Value::Value((Value *)&local_2c8,2);
          local_368._M_unused._M_member_pointer =
               local_368._M_unused._M_member_pointer & 0xffffffff00000000;
          local_318.string_ = (char *)&local_2c8;
          if ((anonymous_namespace)::UIntHelper._16_8_ == 0) goto LAB_00176575;
          iVar8 = (*(code *)(anonymous_namespace)::UIntHelper._24_8_)
                            ((anonymous_namespace)::UIntHelper,&local_368,&local_318);
          if (iVar8 == 0) {
            if (local_368._0_4_ == 2) {
              local_368._M_unused._M_member_pointer =
                   local_368._M_unused._M_member_pointer & 0xffffffff00000000;
              Json::Value::Value((Value *)&local_318,nullValue);
              Json::Value::operator=((Value *)&local_2c8,(Value *)&local_318);
              Json::Value::~Value((Value *)&local_318);
              local_318.string_ = (char *)&local_2c8;
              if ((anonymous_namespace)::UIntHelper._16_8_ == 0) {
LAB_00176575:
                std::__throw_bad_function_call();
              }
              iVar8 = (*(code *)(anonymous_namespace)::UIntHelper._24_8_)
                                ((anonymous_namespace)::UIntHelper,&local_368,&local_318);
              if (iVar8 != 1) {
                iVar8 = 0x65;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "ASSERT_TRUE(UIntHelper(i, &v) == ErrorCode::InvalidInt) failed on line "
                           ,0x47);
                goto LAB_00174ff1;
              }
              local_368._M_unused._M_member_pointer =
                   local_368._M_unused._M_member_pointer & 0xffffffff00000000;
              local_318.int_ = 0;
              if ((anonymous_namespace)::UIntHelper._16_8_ == 0) goto LAB_00176575;
              iVar8 = (*(code *)(anonymous_namespace)::UIntHelper._24_8_)
                                ((anonymous_namespace)::UIntHelper,&local_368,&local_318);
              if (iVar8 == 0) {
                if (local_368._0_4_ == 1) {
                  Json::Value::~Value((Value *)&local_2c8);
                  Json::Value::Value((Value *)&local_2c8,true);
                  local_368._M_unused._M_member_pointer =
                       local_368._M_unused._M_member_pointer & 0xffffffffffffff00;
                  local_318.string_ = (char *)&local_2c8;
                  if ((anonymous_namespace)::BoolHelper._16_8_ == 0) goto LAB_00176d8c;
                  iVar8 = (*(code *)(anonymous_namespace)::BoolHelper._24_8_)
                                    ((anonymous_namespace)::BoolHelper,&local_368,&local_318);
                  if (iVar8 == 0) {
                    if (local_368._M_pod_data[0] == '\0') {
                      iVar8 = 0x73;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"ASSERT_TRUE(b) failed on line ",0x1e);
                    }
                    else {
                      local_368._M_unused._M_member_pointer =
                           local_368._M_unused._M_member_pointer & 0xffffffffffffff00;
                      Json::Value::Value((Value *)&local_318,false);
                      Json::Value::operator=((Value *)&local_2c8,(Value *)&local_318);
                      Json::Value::~Value((Value *)&local_318);
                      local_318.string_ = (char *)&local_2c8;
                      if ((anonymous_namespace)::BoolHelper._16_8_ == 0) goto LAB_00176d8c;
                      iVar8 = (*(code *)(anonymous_namespace)::BoolHelper._24_8_)
                                        ((anonymous_namespace)::BoolHelper,&local_368,&local_318);
                      if (iVar8 == 0) {
                        if (local_368._M_pod_data[0] == '\x01') {
                          iVar8 = 0x78;
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"ASSERT_TRUE(!b) failed on line ",0x1f);
                        }
                        else {
                          local_368._M_unused._M_member_pointer =
                               local_368._M_unused._M_member_pointer & 0xffffffffffffff00;
                          Json::Value::Value((Value *)&local_318,4);
                          Json::Value::operator=((Value *)&local_2c8,(Value *)&local_318);
                          Json::Value::~Value((Value *)&local_318);
                          local_318.string_ = (char *)&local_2c8;
                          if ((anonymous_namespace)::BoolHelper._16_8_ == 0) {
LAB_00176d8c:
                            std::__throw_bad_function_call();
                          }
                          iVar8 = (*(code *)(anonymous_namespace)::BoolHelper._24_8_)
                                            ((anonymous_namespace)::BoolHelper,&local_368,&local_318
                                            );
                          if (iVar8 != 2) {
                            iVar8 = 0x7c;
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,
                                       "ASSERT_TRUE(BoolHelper(b, &v) == ErrorCode::InvalidBool) failed on line "
                                       ,0x48);
                            goto LAB_00175143;
                          }
                          local_368._M_pod_data[0] = 1;
                          local_318.int_ = 0;
                          if ((anonymous_namespace)::BoolHelper._16_8_ == 0) goto LAB_00176d8c;
                          iVar8 = (*(code *)(anonymous_namespace)::BoolHelper._24_8_)
                                            ((anonymous_namespace)::BoolHelper,&local_368,&local_318
                                            );
                          if (iVar8 == 0) {
                            if (local_368._M_pod_data[0] != '\x01') {
                              Json::Value::~Value((Value *)&local_2c8);
                              Json::Value::Value((Value *)&local_2c8,"str");
                              local_368._M_unused._M_object = &aStack_358;
                              local_368._M_pod_data[8] = '\0';
                              local_368._9_7_ = 0;
                              aStack_358._M_local_buf[0] = '\0';
                              local_318.string_ = (char *)&local_2c8;
                              if ((anonymous_namespace)::StringHelper_abi_cxx11_._16_8_ == 0)
                              goto LAB_00176e69;
                              iVar8 = (*(code *)(anonymous_namespace)::StringHelper_abi_cxx11_.
                                                _24_8_)((anonymous_namespace)::
                                                        StringHelper_abi_cxx11_,&local_368,
                                                        &local_318);
                              if (iVar8 == 0) {
                                iVar8 = std::__cxx11::string::compare(local_368._M_pod_data);
                                if (iVar8 != 0) {
                                  iVar8 = 0x8a;
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,
                                             "ASSERT_TRUE(str == \"str\") failed on line ",0x29);
                                  goto LAB_0017542f;
                                }
                                in_R8 = 0;
                                std::__cxx11::string::_M_replace
                                          ((ulong)&local_368,0,
                                           (char *)CONCAT71(local_368._9_7_,local_368._M_pod_data[8]
                                                           ),0x806b49);
                                Json::Value::Value((Value *)&local_318,nullValue);
                                Json::Value::operator=((Value *)&local_2c8,(Value *)&local_318);
                                Json::Value::~Value((Value *)&local_318);
                                local_318.string_ = (char *)&local_2c8;
                                if ((anonymous_namespace)::StringHelper_abi_cxx11_._16_8_ == 0) {
LAB_00176e69:
                                  std::__throw_bad_function_call();
                                }
                                iVar8 = (*(code *)(anonymous_namespace)::StringHelper_abi_cxx11_.
                                                  _24_8_)((anonymous_namespace)::
                                                          StringHelper_abi_cxx11_,&local_368,
                                                          &local_318);
                                if (iVar8 != 3) {
                                  iVar8 = 0x8e;
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,
                                             "ASSERT_TRUE(StringHelper(str, &v) == ErrorCode::InvalidString) failed on line "
                                             ,0x4e);
                                  goto LAB_0017542f;
                                }
                                in_R8 = 0;
                                std::__cxx11::string::_M_replace
                                          ((ulong)&local_368,0,
                                           (char *)CONCAT71(local_368._9_7_,local_368._M_pod_data[8]
                                                           ),0x806b49);
                                local_318.int_ = 0;
                                if ((anonymous_namespace)::StringHelper_abi_cxx11_._16_8_ == 0)
                                goto LAB_00176e69;
                                iVar8 = (*(code *)(anonymous_namespace)::StringHelper_abi_cxx11_.
                                                  _24_8_)((anonymous_namespace)::
                                                          StringHelper_abi_cxx11_,&local_368,
                                                          &local_318);
                                if (iVar8 != 0) {
                                  iVar8 = 0x91;
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,
                                             "ASSERT_TRUE(StringHelper(str, nullptr) == ErrorCode::Success) failed on line "
                                             ,0x4d);
                                  goto LAB_0017542f;
                                }
                                iVar8 = std::__cxx11::string::compare(local_368._M_pod_data);
                                if (iVar8 != 0) {
                                  iVar8 = 0x92;
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,
                                             "ASSERT_TRUE(str == \"default\") failed on line ",0x2d)
                                  ;
                                  goto LAB_0017542f;
                                }
                                bVar7 = true;
                              }
                              else {
                                iVar8 = 0x89;
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,
                                           "ASSERT_TRUE(StringHelper(str, &v) == ErrorCode::Success) failed on line "
                                           ,0x48);
LAB_0017542f:
                                poVar10 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
                                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                                bVar7 = false;
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_368._M_unused._0_8_ != &aStack_358) {
                                operator_delete(local_368._M_unused._M_object,
                                                CONCAT71(aStack_358._M_allocated_capacity._1_7_,
                                                         aStack_358._M_local_buf[0]) + 1);
                              }
                              Json::Value::~Value((Value *)&local_2c8);
                              if (!bVar7) {
                                return 1;
                              }
                              uStack_308 = 0;
                              uStack_307 = 0;
                              uStack_300 = uStack_300 & 0xffffff00;
                              local_318.int_ = 0;
                              uStack_310 = 0;
                              uStack_30f = 0;
                              uStack_2fc = 0;
                              uStack_2f8 = 4;
                              local_2f4 = 1;
                              local_368._M_unused._M_member_pointer = 8;
                              local_368._M_pod_data[8] = 'b';
                              local_368._9_7_ = 0x77bb;
                              std::
                              function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>
                              ::function((function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>
                                          *)&local_50,
                                         (function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>
                                          *)(anonymous_namespace)::IntHelper);
                              cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                              Object<(anonymous_namespace)::ObjectStruct>::
                              Bind<(anonymous_namespace)::ObjectStruct,int,std::function<(anonymous_namespace)::ErrorCode(int&,Json::Value_const*)>>
                                        ((Object<(anonymous_namespace)::ObjectStruct> *)&local_318,
                                         (string_view *)&local_368,
                                         (offset_in_ObjectStruct_to_int)&local_50,
                                         (function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>
                                          *)0x1,SUB81(in_R8,0));
                              cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                              Object<(anonymous_namespace)::ObjectStruct>::Object
                                        ((Object<(anonymous_namespace)::ObjectStruct> *)&local_2c8,
                                         (Object<(anonymous_namespace)::ObjectStruct> *)&local_318);
                              if (local_40 != (code *)0x0) {
                                (*local_40)(&local_50,&local_50,__destroy_functor);
                              }
                              required = (undefined1)in_R8;
                              pvVar4 = (void *)CONCAT71(uStack_30f,uStack_310);
                              if (local_318 != pvVar4) {
                                pp_Var16 = &((local_318.map_)->_M_t)._M_impl.super__Rb_tree_header.
                                            _M_header._M_parent;
                                do {
                                  if (pp_Var16[2] != (_Base_ptr)0x0) {
                                    (*(code *)pp_Var16[2])(pp_Var16,pp_Var16,3);
                                  }
                                  required = (undefined1)in_R8;
                                  pvVar14 = pp_Var16 + 5;
                                  pp_Var16 = pp_Var16 + 7;
                                } while (pvVar14 != pvVar4);
                              }
                              if (local_318 != (void *)0x0) {
                                operator_delete(local_318.string_,
                                                CONCAT71(uStack_307,uStack_308) - (long)local_318);
                              }
                              aStack_358._M_local_buf[0] = '\0';
                              aStack_358._M_allocated_capacity._1_7_ = 0;
                              aStack_358._8_4_ = aStack_358._8_4_ & 0xffffff00;
                              local_368._M_unused._M_object = (void *)0x0;
                              local_368._M_pod_data[8] = '\0';
                              local_368._9_7_ = 0;
                              aStack_358._12_4_ = 0;
                              uStack_348 = 5;
                              local_344 = 1;
                              local_168._0_8_ =
                                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)0x6;
                              local_168._8_8_ = "field1";
                              std::
                              function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                              ::function((function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                                          *)&local_70,
                                         (function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                                          *)(anonymous_namespace)::StringHelper_abi_cxx11_);
                              cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                              Object<(anonymous_namespace)::ObjectStruct>::
                              Bind<(anonymous_namespace)::ObjectStruct,std::__cxx11::string,std::function<(anonymous_namespace)::ErrorCode(std::__cxx11::string&,Json::Value_const*)>>
                                        ((Object<(anonymous_namespace)::ObjectStruct> *)&local_368,
                                         (string_view *)local_168,
                                         (offset_in_ObjectStruct_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          )&local_70,
                                         (function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                                          *)0x1,(bool)required);
                              local_d8.super_ObjectStruct.Field1._M_dataplus._M_p = (pointer)0x6;
                              local_d8.super_ObjectStruct.Field1._M_string_length = 0x77bb72;
                              cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                              Object<(anonymous_namespace)::ObjectStruct>::Object
                                        ((Object<(anonymous_namespace)::ObjectStruct> *)&local_120,
                                         (Object<(anonymous_namespace)::ObjectStruct> *)&local_2c8);
                              local_228._8_8_ = 0;
                              this = (Object<(anonymous_namespace)::ObjectStruct> *)
                                     operator_new(0x28);
                              cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                              Object<(anonymous_namespace)::ObjectStruct>::Object
                                        (this,(Object<(anonymous_namespace)::ObjectStruct> *)
                                              &local_120);
                              local_218._8_8_ =
                                   std::
                                   _Function_handler<(anonymous_namespace)::ErrorCode_((anonymous_namespace)::ObjectStruct_&,_const_Json::Value_*),_cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>_>
                                   ::_M_invoke;
                              local_218._0_8_ =
                                   std::
                                   _Function_handler<(anonymous_namespace)::ErrorCode_((anonymous_namespace)::ObjectStruct_&,_const_Json::Value_*),_cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::ObjectStruct>_>
                                   ::_M_manager;
                              local_228._0_8_ = this;
                              cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                              Object<(anonymous_namespace)::ObjectStruct>::BindPrivate
                                        ((Object<(anonymous_namespace)::ObjectStruct> *)&local_368,
                                         (string_view *)&local_d8,(MemberFunction *)local_228,true);
                              if ((_Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
                                   )local_218._0_8_ !=
                                  (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                                   *)0x0) {
                                (*(code *)local_218._0_8_)(local_228,local_228,3);
                              }
                              local_228._0_8_ = 6;
                              local_228._8_8_ = "field3";
                              std::
                              function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                              ::function((function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                                          *)&local_90,
                                         (function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                                          *)(anonymous_namespace)::StringHelper_abi_cxx11_);
                              cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                              Object<(anonymous_namespace)::ObjectStruct>::
                              Bind<std::__cxx11::string,std::function<(anonymous_namespace)::ErrorCode(std::__cxx11::string&,Json::Value_const*)>>
                                        ((Object<(anonymous_namespace)::ObjectStruct> *)&local_368,
                                         (string_view *)local_228,&local_90,
                                         (function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                                          *)0x1,(bool)required);
                              cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                              Object<(anonymous_namespace)::ObjectStruct>::Object
                                        ((Object<(anonymous_namespace)::ObjectStruct> *)&local_318,
                                         (Object<(anonymous_namespace)::ObjectStruct> *)&local_368);
                              if (local_80 != (code *)0x0) {
                                (*local_80)(&local_90,&local_90,__destroy_functor);
                              }
                              if (local_120 != local_118) {
                                p_Var15 = (_Any_data *)
                                          &((local_120.map_)->_M_t)._M_impl.super__Rb_tree_header.
                                           _M_header._M_parent;
                                do {
                                  if (*(code **)(p_Var15 + 1) != (code *)0x0) {
                                    (**(code **)(p_Var15 + 1))(p_Var15,p_Var15,__destroy_functor);
                                  }
                                  lVar22 = (long)p_Var15 + 0x28;
                                  p_Var15 = (_Any_data *)(p_Var15->_M_pod_data + 0x38);
                                } while ((char *)lVar22 != local_118);
                              }
                              if (local_120 != (void *)0x0) {
                                operator_delete(local_120.string_,
                                                CONCAT71(uStack_10f,local_110) - (long)local_120);
                              }
                              if (local_60 != (code *)0x0) {
                                (*local_60)(&local_70,&local_70,__destroy_functor);
                              }
                              p_Var18 = (_func_void *)
                                        CONCAT71(local_368._9_7_,local_368._M_pod_data[8]);
                              if ((_func_void *)local_368._M_unused._0_8_ != p_Var18) {
                                p_Var15 = (_Any_data *)
                                          (local_368._M_unused._M_function_pointer + 0x10);
                                do {
                                  if (*(code **)(p_Var15 + 1) != (code *)0x0) {
                                    (**(code **)(p_Var15 + 1))(p_Var15,p_Var15,__destroy_functor);
                                  }
                                  lVar22 = (long)p_Var15 + 0x28;
                                  p_Var15 = (_Any_data *)(p_Var15->_M_pod_data + 0x38);
                                } while ((_func_void *)lVar22 != p_Var18);
                              }
                              if ((_func_void *)local_368._M_unused._0_8_ != (_func_void *)0x0) {
                                operator_delete(local_368._M_unused._M_object,
                                                CONCAT71(aStack_358._M_allocated_capacity._1_7_,
                                                         aStack_358._M_local_buf[0]) -
                                                local_368._0_8_);
                              }
                              Json::Value::Value((Value *)&local_368,objectValue);
                              Json::Value::Value((Value *)local_228,"Hello");
                              pVVar11 = Json::Value::operator[]((Value *)&local_368,"field1");
                              Json::Value::operator=(pVVar11,(Value *)local_228);
                              Json::Value::~Value((Value *)local_228);
                              Json::Value::Value((Value *)local_228,objectValue);
                              pVVar11 = Json::Value::operator[]((Value *)&local_368,"field2");
                              Json::Value::operator=(pVVar11,(Value *)local_228);
                              Json::Value::~Value((Value *)local_228);
                              Json::Value::Value((Value *)local_228,2);
                              pVVar11 = Json::Value::operator[]((Value *)&local_368,"field2");
                              pVVar11 = Json::Value::operator[](pVVar11,"subfield");
                              Json::Value::operator=(pVVar11,(Value *)local_228);
                              Json::Value::~Value((Value *)local_228);
                              Json::Value::Value((Value *)local_228,"world!");
                              pVVar11 = Json::Value::operator[]((Value *)&local_368,"field3");
                              Json::Value::operator=(pVVar11,(Value *)local_228);
                              Json::Value::~Value((Value *)local_228);
                              Json::Value::Value((Value *)local_228,"extra");
                              pVVar11 = Json::Value::operator[]((Value *)&local_368,"extra");
                              Json::Value::operator=(pVVar11,(Value *)local_228);
                              Json::Value::~Value((Value *)local_228);
                              local_228._0_8_ = local_218;
                              local_228._8_8_ = 0;
                              local_218._0_8_ = local_218._0_8_ & 0xffffffffffffff00;
                              EVar9 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                                      Object<(anonymous_namespace)::ObjectStruct>::operator()
                                                ((Object<(anonymous_namespace)::ObjectStruct> *)
                                                 &local_318,(ObjectStruct *)local_228,
                                                 (Value *)&local_368);
                              if (EVar9 == Success) {
                                iVar8 = std::__cxx11::string::compare(local_228);
                                if (iVar8 != 0) {
                                  iVar8 = 0xac;
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,
                                             "ASSERT_TRUE(s1.Field1 == \"Hello\") failed on line ",
                                             0x31);
                                  goto LAB_00175d3b;
                                }
                                if (local_208 != 2) {
                                  iVar8 = 0xad;
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,
                                             "ASSERT_TRUE(s1.Field2 == 2) failed on line ",0x2b);
                                  goto LAB_00175d3b;
                                }
                                Json::Value::Value((Value *)local_168,"wrong");
                                pVVar11 = Json::Value::operator[]((Value *)&local_368,"field2");
                                pVVar11 = Json::Value::operator[](pVVar11,"subfield");
                                Json::Value::operator=(pVVar11,(Value *)local_168);
                                Json::Value::~Value((Value *)local_168);
                                local_168._8_8_ = (char *)0x0;
                                local_158._M_local_buf[0] = '\0';
                                local_168._0_8_ = &local_158;
                                EVar9 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                                        Object<(anonymous_namespace)::ObjectStruct>::operator()
                                                  ((Object<(anonymous_namespace)::ObjectStruct> *)
                                                   &local_318,(ObjectStruct *)local_168,
                                                   (Value *)&local_368);
                                if (EVar9 == InvalidInt) {
                                  pVVar11 = Json::Value::operator[]((Value *)&local_368,"field2");
                                  Json::Value::removeMember(pVVar11,"subfield");
                                  local_d8.super_ObjectStruct.Field1._M_dataplus._M_p =
                                       (pointer)&local_d8.super_ObjectStruct.Field1.field_2;
                                  local_d8.super_ObjectStruct.Field1._M_string_length = 0;
                                  local_d8.super_ObjectStruct.Field1.field_2._M_local_buf[0] = '\0';
                                  EVar9 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                                          Object<(anonymous_namespace)::ObjectStruct>::operator()
                                                    ((Object<(anonymous_namespace)::ObjectStruct> *)
                                                     &local_318,&local_d8.super_ObjectStruct,
                                                     (Value *)&local_368);
                                  if (EVar9 == InvalidSubObject) {
                                    Json::Value::removeMember((Value *)&local_368,"field2");
                                    local_258._0_8_ = local_258 + 0x10;
                                    local_258._8_8_ = (pointer)0x0;
                                    local_258._16_8_ = local_258._16_8_ & 0xffffffffffffff00;
                                    EVar9 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                                            Object<(anonymous_namespace)::ObjectStruct>::operator()
                                                      ((Object<(anonymous_namespace)::ObjectStruct>
                                                        *)&local_318,(ObjectStruct *)local_258,
                                                       (Value *)&local_368);
                                    if (EVar9 == InvalidObject) {
                                      Json::Value::Value((Value *)&local_280,objectValue);
                                      pVVar11 = Json::Value::operator[]
                                                          ((Value *)&local_368,"field2");
                                      Json::Value::operator=(pVVar11,(Value *)&local_280);
                                      Json::Value::~Value((Value *)&local_280);
                                      Json::Value::Value((Value *)&local_280,2);
                                      pVVar11 = Json::Value::operator[]
                                                          ((Value *)&local_368,"field2");
                                      pVVar11 = Json::Value::operator[](pVVar11,"subfield");
                                      Json::Value::operator=(pVVar11,(Value *)&local_280);
                                      Json::Value::~Value((Value *)&local_280);
                                      Json::Value::Value((Value *)&local_280,3);
                                      pVVar11 = Json::Value::operator[]
                                                          ((Value *)&local_368,"field3");
                                      Json::Value::operator=(pVVar11,(Value *)&local_280);
                                      Json::Value::~Value((Value *)&local_280);
                                      local_280.string_ = (char *)&local_270;
                                      local_278 = 0;
                                      local_270._M_local_buf[0] = '\0';
                                      EVar9 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>
                                              ::Object<(anonymous_namespace)::ObjectStruct>::
                                              operator()((
                                                  Object<(anonymous_namespace)::ObjectStruct> *)
                                                  &local_318,(ObjectStruct *)&local_280,
                                                  (Value *)&local_368);
                                      if (EVar9 == InvalidString) {
                                        Json::Value::removeMember((Value *)&local_368,"field3");
                                        local_190._M_unused._M_object = &local_180;
                                        local_190._8_8_ = 0;
                                        local_180._M_local_buf[0] = '\0';
                                        EVar9 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>
                                                ::Object<(anonymous_namespace)::ObjectStruct>::
                                                operator()((
                                                  Object<(anonymous_namespace)::ObjectStruct> *)
                                                  &local_318,(ObjectStruct *)&local_190,
                                                  (Value *)&local_368);
                                        if (EVar9 == InvalidObject) {
                                          Json::Value::Value((Value *)&local_1e0,"Hello");
                                          Json::Value::operator=
                                                    ((Value *)&local_368,(Value *)&local_1e0);
                                          Json::Value::~Value((Value *)&local_1e0);
                                          local_1e0._M_unused._M_object = &local_1d0;
                                          local_1e0._8_8_ = 0;
                                          local_1d0._M_local_buf[0] = '\0';
                                          EVar9 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>
                                                  ::Object<(anonymous_namespace)::ObjectStruct>::
                                                  operator()((
                                                  Object<(anonymous_namespace)::ObjectStruct> *)
                                                  &local_318,(ObjectStruct *)&local_1e0,
                                                  (Value *)&local_368);
                                          if (EVar9 == InvalidObject) {
                                            local_1b8._M_unused._M_object = &local_1a8;
                                            local_1b8._8_8_ = 0;
                                            local_1a8._M_local_buf[0] = '\0';
                                            EVar9 = 
                                                  cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>
                                                  ::Object<(anonymous_namespace)::ObjectStruct>::
                                                  operator()((
                                                  Object<(anonymous_namespace)::ObjectStruct> *)
                                                  &local_318,(ObjectStruct *)&local_1b8,(Value *)0x0
                                                  );
                                            bVar7 = EVar9 == InvalidObject;
                                            if (!bVar7) {
                                              std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,
                                                                                                                  
                                                  "ASSERT_TRUE(helper(s8, nullptr) == ErrorCode::InvalidObject) failed on line "
                                                  ,0x4c);
                                              poVar10 = (ostream *)
                                                        std::ostream::operator<<(&std::cout,0xca);
                                              std::__ostream_insert<char,std::char_traits<char>>
                                                        (poVar10,"\n",1);
                                            }
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_1b8._M_unused._0_8_ != &local_1a8) {
                                              operator_delete(local_1b8._M_unused._M_object,
                                                              CONCAT71(local_1a8.
                                                                       _M_allocated_capacity._1_7_,
                                                                       local_1a8._M_local_buf[0]) +
                                                              1);
                                            }
                                          }
                                          else {
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      ((ostream *)&std::cout,
                                                                                                              
                                                  "ASSERT_TRUE(helper(s7, &v) == ErrorCode::InvalidObject) failed on line "
                                                  ,0x47);
                                            poVar10 = (ostream *)
                                                      std::ostream::operator<<(&std::cout,199);
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      (poVar10,"\n",1);
                                            bVar7 = false;
                                          }
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_1e0._M_unused._0_8_ != &local_1d0) {
                                            operator_delete(local_1e0._M_unused._M_object,
                                                            CONCAT71(local_1d0._M_allocated_capacity
                                                                     ._1_7_,local_1d0._M_local_buf
                                                                            [0]) + 1);
                                          }
                                        }
                                        else {
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,
                                                                                                          
                                                  "ASSERT_TRUE(helper(s6, &v) == ErrorCode::InvalidObject) failed on line "
                                                  ,0x47);
                                          poVar10 = (ostream *)
                                                    std::ostream::operator<<(&std::cout,0xc3);
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    (poVar10,"\n",1);
                                          bVar7 = false;
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_190._M_unused._0_8_ != &local_180) {
                                          operator_delete(local_190._M_unused._M_object,
                                                          CONCAT71(local_180._M_allocated_capacity.
                                                                   _1_7_,local_180._M_local_buf[0])
                                                          + 1);
                                        }
                                      }
                                      else {
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,
                                                                                                      
                                                  "ASSERT_TRUE(helper(s5, &v) == ErrorCode::InvalidString) failed on line "
                                                  ,0x47);
                                        poVar10 = (ostream *)
                                                  std::ostream::operator<<(&std::cout,0xbf);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar10,"\n",1);
                                        bVar7 = false;
                                      }
                                      if (local_280 != &local_270) {
                                        operator_delete(local_280.string_,
                                                        CONCAT71(local_270._M_allocated_capacity.
                                                                 _1_7_,local_270._M_local_buf[0]) +
                                                        1);
                                      }
                                    }
                                    else {
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cout,
                                                 "ASSERT_TRUE(helper(s4, &v) == ErrorCode::InvalidObject) failed on line "
                                                 ,0x47);
                                      poVar10 = (ostream *)std::ostream::operator<<(&std::cout,0xb9)
                                      ;
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar10,"\n",1);
                                      bVar7 = false;
                                    }
                                    if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
                                      operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
                                    }
                                  }
                                  else {
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,
                                               "ASSERT_TRUE(helper(s3, &v) == ErrorCode::InvalidSubObject) failed on line "
                                               ,0x4a);
                                    poVar10 = (ostream *)std::ostream::operator<<(&std::cout,0xb5);
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar10,"\n",1);
                                    bVar7 = false;
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_d8.super_ObjectStruct.Field1._M_dataplus._M_p !=
                                      &local_d8.super_ObjectStruct.Field1.field_2) {
                                    operator_delete(local_d8.super_ObjectStruct.Field1._M_dataplus.
                                                    _M_p,CONCAT71(local_d8.super_ObjectStruct.Field1
                                                                  .field_2._M_allocated_capacity.
                                                                  _1_7_,local_d8.super_ObjectStruct.
                                                                        Field1.field_2._M_local_buf
                                                                        [0]) + 1);
                                  }
                                }
                                else {
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,
                                             "ASSERT_TRUE(helper(s2, &v) == ErrorCode::InvalidInt) failed on line "
                                             ,0x44);
                                  poVar10 = (ostream *)std::ostream::operator<<(&std::cout,0xb1);
                                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1)
                                  ;
                                  bVar7 = false;
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_168._0_8_ != &local_158) {
                                  operator_delete((void *)local_168._0_8_,
                                                  CONCAT71(local_158._M_allocated_capacity._1_7_,
                                                           local_158._M_local_buf[0]) + 1);
                                }
                              }
                              else {
                                iVar8 = 0xab;
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,
                                           "ASSERT_TRUE(helper(s1, &v) == ErrorCode::Success) failed on line "
                                           ,0x41);
LAB_00175d3b:
                                poVar10 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
                                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                                bVar7 = false;
                              }
                              if ((undefined1 *)local_228._0_8_ != local_218) {
                                operator_delete((void *)local_228._0_8_,(ulong)(local_218._0_8_ + 1)
                                               );
                              }
                              Json::Value::~Value((Value *)&local_368);
                              pvVar4 = (void *)CONCAT71(uStack_30f,uStack_310);
                              if (local_318 != pvVar4) {
                                pp_Var16 = &((local_318.map_)->_M_t)._M_impl.super__Rb_tree_header.
                                            _M_header._M_parent;
                                do {
                                  if (pp_Var16[2] != (_Base_ptr)0x0) {
                                    (*(code *)pp_Var16[2])(pp_Var16,pp_Var16,3);
                                  }
                                  pvVar14 = pp_Var16 + 5;
                                  pp_Var16 = pp_Var16 + 7;
                                } while (pvVar14 != pvVar4);
                              }
                              if (local_318 != (void *)0x0) {
                                operator_delete(local_318.string_,
                                                CONCAT71(uStack_307,uStack_308) - (long)local_318);
                              }
                              uVar13 = local_2c8._8_8_;
                              if (local_2c8._M_unused._M_object != (void *)local_2c8._8_8_) {
                                pcVar17 = local_2c8._M_unused._M_function_pointer + 0x10;
                                do {
                                  if (*(code **)(pcVar17 + 0x10) != (code *)0x0) {
                                    (**(code **)(pcVar17 + 0x10))(pcVar17,pcVar17,3);
                                  }
                                  p_Var18 = pcVar17 + 0x28;
                                  pcVar17 = pcVar17 + 0x38;
                                } while (p_Var18 != (_func_void *)uVar13);
                              }
                              if ((_func_void *)local_2c8._M_unused._0_8_ != (_func_void *)0x0) {
                                operator_delete(local_2c8._M_unused._M_object,
                                                local_2b8._M_allocated_capacity - local_2c8._0_8_);
                              }
                              if (!bVar7) {
                                return 1;
                              }
                              uStack_308 = 0;
                              uStack_307 = 0;
                              uStack_300 = uStack_300 & 0xffffff00;
                              local_318.int_ = 0;
                              uStack_310 = 0;
                              uStack_30f = 0;
                              uStack_2fc = 0;
                              uStack_2f8 = 5;
                              local_2f4 = 1;
                              local_120.int_ = 6;
                              local_118 = "field1";
                              std::
                              function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                              ::function((function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                                          *)&local_190,
                                         (function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                                          *)(anonymous_namespace)::StringHelper_abi_cxx11_);
                              std::
                              function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                              ::function((function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                                          *)&local_2c8,
                                         (function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                                          *)&local_190);
                              local_2a8 = 0;
                              local_368._M_unused._M_object = (void *)0x0;
                              local_368._M_pod_data[8] = '\0';
                              local_368._9_7_ = 0;
                              aStack_358._M_local_buf[0] = '\0';
                              aStack_358._M_allocated_capacity._1_7_ = 0;
                              aStack_358._8_4_ = 0;
                              aStack_358._12_4_ = 0;
                              local_368._M_unused._M_object = operator_new(0x28);
                              *(size_type *)local_368._M_unused._0_8_ = 0;
                              *(size_type *)((long)local_368._M_unused._0_8_ + 8) = 0;
                              *(size_type *)((long)local_368._M_unused._0_8_ + 0x10) = 0;
                              *(undefined8 *)((long)local_368._M_unused._0_8_ + 0x18) =
                                   local_2b8._8_8_;
                              uVar13 = local_2b8._M_allocated_capacity;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_2b8._M_allocated_capacity !=
                                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x0) {
                                *(void **)local_368._M_unused._0_8_ = local_2c8._M_unused._M_object;
                                *(undefined8 *)((long)local_368._M_unused._0_8_ + 8) =
                                     local_2c8._8_8_;
                                *(size_type *)((long)local_368._M_unused._0_8_ + 0x10) =
                                     local_2b8._M_allocated_capacity;
                                uVar13 = &local_2b8;
                                local_2b8._M_allocated_capacity = 0;
                                local_2b8._8_8_ = 0;
                              }
                              *(size_type *)((long)local_368._M_unused._0_8_ + 0x20) = 0;
                              aStack_358._8_4_ = 0x17b0ec;
                              aStack_358._12_4_ = 0;
                              aStack_358._M_local_buf[0] = '\x12';
                              aStack_358._M_allocated_capacity._1_7_ = 0x17b1;
                              cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                              Object<(anonymous_namespace)::InheritedStruct>::BindPrivate
                                        ((Object<(anonymous_namespace)::InheritedStruct> *)
                                         &local_318,(string_view *)&local_120,
                                         (MemberFunction *)&local_368,SUB81(uVar13,0));
                              if ((code *)CONCAT71(aStack_358._M_allocated_capacity._1_7_,
                                                   aStack_358._M_local_buf[0]) != (code *)0x0) {
                                (*(code *)CONCAT71(aStack_358._M_allocated_capacity._1_7_,
                                                   aStack_358._M_local_buf[0]))
                                          (&local_368,&local_368,3);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_2b8._M_allocated_capacity !=
                                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x0) {
                                (*(code *)local_2b8._M_allocated_capacity)(&local_2c8,&local_2c8,3);
                              }
                              local_228._0_8_ = (undefined1 *)0x6;
                              local_228._8_8_ = "field2";
                              std::
                              function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>
                              ::function((function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>
                                          *)&local_1e0,
                                         (function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>
                                          *)(anonymous_namespace)::IntHelper);
                              std::
                              function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>
                              ::function((function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>
                                          *)&local_2c8,
                                         (function<(anonymous_namespace)::ErrorCode_(int_&,_const_Json::Value_*)>
                                          *)&local_1e0);
                              local_2a8 = 0x20;
                              local_368._M_unused._M_object = (void *)0x0;
                              local_368._M_pod_data[8] = '\0';
                              local_368._9_7_ = 0;
                              aStack_358._M_local_buf[0] = '\0';
                              aStack_358._M_allocated_capacity._1_7_ = 0;
                              aStack_358._8_4_ = 0;
                              aStack_358._12_4_ = 0;
                              local_368._M_unused._M_object = operator_new(0x28);
                              *(size_type *)local_368._M_unused._0_8_ = 0;
                              *(size_type *)((long)local_368._M_unused._0_8_ + 8) = 0;
                              *(size_type *)((long)local_368._M_unused._0_8_ + 0x10) = 0;
                              *(undefined8 *)((long)local_368._M_unused._0_8_ + 0x18) =
                                   local_2b8._8_8_;
                              uVar13 = local_2b8._M_allocated_capacity;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_2b8._M_allocated_capacity !=
                                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x0) {
                                *(void **)local_368._M_unused._0_8_ = local_2c8._M_unused._M_object;
                                *(undefined8 *)((long)local_368._M_unused._0_8_ + 8) =
                                     local_2c8._8_8_;
                                *(size_type *)((long)local_368._M_unused._0_8_ + 0x10) =
                                     local_2b8._M_allocated_capacity;
                                uVar13 = &local_2b8;
                                local_2b8._M_allocated_capacity = 0;
                                local_2b8._8_8_ = 0;
                              }
                              *(size_type *)((long)local_368._M_unused._0_8_ + 0x20) = 0x20;
                              aStack_358._8_4_ = 0x17b1ba;
                              aStack_358._12_4_ = 0;
                              aStack_358._M_local_buf[0] = -0x20;
                              aStack_358._M_allocated_capacity._1_7_ = 0x17b1;
                              cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                              Object<(anonymous_namespace)::InheritedStruct>::BindPrivate
                                        ((Object<(anonymous_namespace)::InheritedStruct> *)
                                         &local_318,(string_view *)local_228,
                                         (MemberFunction *)&local_368,SUB81(uVar13,0));
                              if ((code *)CONCAT71(aStack_358._M_allocated_capacity._1_7_,
                                                   aStack_358._M_local_buf[0]) != (code *)0x0) {
                                (*(code *)CONCAT71(aStack_358._M_allocated_capacity._1_7_,
                                                   aStack_358._M_local_buf[0]))
                                          (&local_368,&local_368,3);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_2b8._M_allocated_capacity !=
                                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x0) {
                                (*(code *)local_2b8._M_allocated_capacity)(&local_2c8,&local_2c8,3);
                              }
                              local_168._0_8_ =
                                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)0x6;
                              local_168._8_8_ = "field3";
                              std::
                              function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                              ::function((function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                                          *)&local_1b8,
                                         (function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                                          *)(anonymous_namespace)::StringHelper_abi_cxx11_);
                              std::
                              function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                              ::function((function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                                          *)&local_2c8,
                                         (function<(anonymous_namespace)::ErrorCode_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*)>
                                          *)&local_1b8);
                              local_2a8 = 0x28;
                              local_368._M_unused._M_object = (void *)0x0;
                              local_368._M_pod_data[8] = '\0';
                              local_368._9_7_ = 0;
                              aStack_358._M_local_buf[0] = '\0';
                              aStack_358._M_allocated_capacity._1_7_ = 0;
                              aStack_358._8_4_ = 0;
                              aStack_358._12_4_ = 0;
                              local_368._M_unused._M_object = operator_new(0x28);
                              *(size_type *)local_368._M_unused._0_8_ = 0;
                              *(undefined8 *)((long)local_368._M_unused._0_8_ + 8) = 0;
                              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)((long)local_368._M_unused._0_8_ + 0x10))->_M_allocated_capacity =
                                   0;
                              *(undefined8 *)((long)local_368._M_unused._0_8_ + 0x18) =
                                   local_2b8._8_8_;
                              uVar13 = local_2b8._M_allocated_capacity;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_2b8._M_allocated_capacity !=
                                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x0) {
                                *(void **)local_368._M_unused._0_8_ = local_2c8._M_unused._M_object;
                                *(undefined8 *)((long)local_368._M_unused._0_8_ + 8) =
                                     local_2c8._8_8_;
                                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)((long)local_368._M_unused._0_8_ + 0x10))->_M_allocated_capacity
                                     = local_2b8._M_allocated_capacity;
                                uVar13 = &local_2b8;
                                local_2b8._M_allocated_capacity = 0;
                                local_2b8._8_8_ = 0;
                              }
                              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)((long)local_368._M_unused._0_8_ + 0x20))->_M_allocated_capacity =
                                   0x28;
                              aStack_358._8_4_ = 0x17b288;
                              aStack_358._12_4_ = 0;
                              aStack_358._M_local_buf[0] = -0x52;
                              aStack_358._M_allocated_capacity._1_7_ = 0x17b2;
                              p_Var15 = (_Any_data *)local_168;
                              cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                              Object<(anonymous_namespace)::InheritedStruct>::BindPrivate
                                        ((Object<(anonymous_namespace)::InheritedStruct> *)
                                         &local_318,(string_view *)p_Var15,
                                         (MemberFunction *)&local_368,SUB81(uVar13,0));
                              if ((code *)CONCAT71(aStack_358._M_allocated_capacity._1_7_,
                                                   aStack_358._M_local_buf[0]) != (code *)0x0) {
                                (*(code *)CONCAT71(aStack_358._M_allocated_capacity._1_7_,
                                                   aStack_358._M_local_buf[0]))
                                          (&local_368,&local_368,3);
                                p_Var15 = p_Var19;
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_2b8._M_allocated_capacity !=
                                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x0) {
                                p_Var15 = &local_2c8;
                                (*(code *)local_2b8._M_allocated_capacity)(p_Var15,p_Var15,3);
                              }
                              lVar22 = CONCAT71(uStack_30f,uStack_310) - (long)local_318;
                              local_258._0_8_ = (pointer)0x0;
                              local_258._8_8_ = (pointer)0x0;
                              local_258._16_8_ = 0;
                              pMVar12 = std::
                                        _Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::InheritedStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::InheritedStruct>::Member>_>
                                        ::_M_allocate((
                                                  _Vector_base<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::InheritedStruct>::Member,_std::allocator<cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::Object<(anonymous_namespace)::InheritedStruct>::Member>_>
                                                  *)((lVar22 >> 3) * 0x6db6db6db6db6db7),
                                                  (size_t)p_Var15);
                              local_258._16_8_ = lVar22 + (long)pMVar12;
                              psVar5 = (size_t *)CONCAT71(uStack_30f,uStack_310);
                              local_258._0_8_ = pMVar12;
                              local_258._8_8_ = pMVar12;
                              uVar6 = uStack_2fc;
                              for (VVar20 = local_318; uStack_2fc = uVar6, VVar20 != psVar5;
                                  VVar20.string_ = (char *)(VVar20.int_ + 0x38)) {
                                pcVar2 = *(char **)&((VVar20.map_)->_M_t)._M_impl.
                                                    super__Rb_tree_header._M_header;
                                (pMVar12->Name)._M_len = *(size_t *)VVar20.string_;
                                (pMVar12->Name)._M_str = pcVar2;
                                *(undefined8 *)&(pMVar12->Function).super__Function_base._M_functor
                                     = 0;
                                *(undefined8 *)
                                 ((long)&(pMVar12->Function).super__Function_base._M_functor + 8) =
                                     0;
                                (pMVar12->Function).super__Function_base._M_manager =
                                     (_Manager_type)0x0;
                                (pMVar12->Function)._M_invoker = (_Invoker_type)0x0;
                                p_Var1 = ((VVar20.map_)->_M_t)._M_impl.super__Rb_tree_header.
                                         _M_header._M_right;
                                if (p_Var1 != (_Base_ptr)0x0) {
                                  (*(code *)p_Var1)(&pMVar12->Function,
                                                    &((VVar20.map_)->_M_t)._M_impl.
                                                     super__Rb_tree_header._M_header._M_parent,2);
                                  p_Var3 = (_Invoker_type)
                                           ((VVar20.map_)->_M_t)._M_impl.super__Rb_tree_header.
                                           _M_node_count;
                                  (pMVar12->Function).super__Function_base._M_manager =
                                       (_Manager_type)
                                       ((VVar20.map_)->_M_t)._M_impl.super__Rb_tree_header._M_header
                                       ._M_right;
                                  (pMVar12->Function)._M_invoker = p_Var3;
                                }
                                pMVar12->Required = *(bool *)(VVar20.int_ + 0x30);
                                pMVar12 = pMVar12 + 1;
                                uVar6 = uStack_2fc;
                              }
                              uStack_2fc._1_3_ = (undefined3)((uint)uVar6 >> 8);
                              local_258._24_5_ = (undefined5)CONCAT44(uVar6,uStack_300);
                              local_258._29_3_ = uStack_2fc._1_3_;
                              local_258._32_5_ =
                                   (undefined5)
                                   (CONCAT17(local_2f4,CONCAT43(uStack_2f8,uStack_2fc._1_3_)) >>
                                   0x18);
                              local_258._8_8_ = pMVar12;
                              if ((code *)CONCAT71(local_1a8._M_allocated_capacity._1_7_,
                                                   local_1a8._M_local_buf[0]) != (code *)0x0) {
                                (*(code *)CONCAT71(local_1a8._M_allocated_capacity._1_7_,
                                                   local_1a8._M_local_buf[0]))
                                          (&local_1b8,&local_1b8,3);
                              }
                              if ((code *)CONCAT71(local_1d0._M_allocated_capacity._1_7_,
                                                   local_1d0._M_local_buf[0]) != (code *)0x0) {
                                (*(code *)CONCAT71(local_1d0._M_allocated_capacity._1_7_,
                                                   local_1d0._M_local_buf[0]))
                                          (&local_1e0,&local_1e0,3);
                              }
                              if ((code *)CONCAT71(local_180._M_allocated_capacity._1_7_,
                                                   local_180._M_local_buf[0]) != (code *)0x0) {
                                (*(code *)CONCAT71(local_180._M_allocated_capacity._1_7_,
                                                   local_180._M_local_buf[0]))
                                          (&local_190,&local_190,3);
                              }
                              psVar5 = (size_t *)CONCAT71(uStack_30f,uStack_310);
                              if (local_318 != psVar5) {
                                pp_Var16 = &((local_318.map_)->_M_t)._M_impl.super__Rb_tree_header.
                                            _M_header._M_parent;
                                do {
                                  if (pp_Var16[2] != (_Base_ptr)0x0) {
                                    (*(code *)pp_Var16[2])(pp_Var16,pp_Var16,3);
                                  }
                                  psVar21 = (size_t *)(pp_Var16 + 5);
                                  pp_Var16 = pp_Var16 + 7;
                                } while (psVar21 != psVar5);
                              }
                              if (local_318 != (size_t *)0x0) {
                                operator_delete(local_318.string_,
                                                CONCAT71(uStack_307,uStack_308) - (long)local_318);
                              }
                              Json::Value::Value((Value *)&local_280,objectValue);
                              Json::Value::Value((Value *)&local_2c8,"Hello");
                              pVVar11 = Json::Value::operator[]((Value *)&local_280,"field1");
                              Json::Value::operator=(pVVar11,(Value *)&local_2c8);
                              Json::Value::~Value((Value *)&local_2c8);
                              Json::Value::Value((Value *)&local_2c8,2);
                              pVVar11 = Json::Value::operator[]((Value *)&local_280,"field2");
                              Json::Value::operator=(pVVar11,(Value *)&local_2c8);
                              Json::Value::~Value((Value *)&local_2c8);
                              Json::Value::Value((Value *)&local_2c8,"world!");
                              pVVar11 = Json::Value::operator[]((Value *)&local_280,"field3");
                              Json::Value::operator=(pVVar11,(Value *)&local_2c8);
                              Json::Value::~Value((Value *)&local_2c8);
                              Json::Value::Value((Value *)&local_2c8,"extra");
                              pVVar11 = Json::Value::operator[]((Value *)&local_280,"extra");
                              Json::Value::operator=(pVVar11,(Value *)&local_2c8);
                              Json::Value::~Value((Value *)&local_2c8);
                              local_2c8._M_unused._M_object = &local_2b8;
                              local_2c8._8_8_ = 0;
                              local_2b8._M_allocated_capacity =
                                   local_2b8._M_allocated_capacity & 0xffffffffffffff00;
                              local_298 = 0;
                              local_290._M_local_buf[0] = '\0';
                              local_2a0._M_p = (pointer)&local_290;
                              EVar9 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>::
                                      Object<(anonymous_namespace)::InheritedStruct>::operator()
                                                ((Object<(anonymous_namespace)::InheritedStruct> *)
                                                 local_258,(InheritedStruct *)&local_2c8,
                                                 (Value *)&local_280);
                              if (EVar9 == Success) {
                                iVar8 = std::__cxx11::string::compare(local_2c8._M_pod_data);
                                if (iVar8 == 0) {
                                  if ((int)local_2a8 == 2) {
                                    iVar8 = std::__cxx11::string::compare((char *)&local_2a0);
                                    if (iVar8 == 0) {
                                      Json::Value::Value((Value *)&local_318,"wrong");
                                      pVVar11 = Json::Value::operator[]
                                                          ((Value *)&local_280,"field2");
                                      Json::Value::operator=(pVVar11,(Value *)&local_318);
                                      Json::Value::~Value((Value *)&local_318);
                                      uStack_310 = 0;
                                      uStack_30f = 0;
                                      uStack_308 = 0;
                                      local_2e8 = 0;
                                      local_2e0._M_local_buf[0] = '\0';
                                      local_318.string_ = &uStack_308;
                                      local_2f0 = &local_2e0;
                                      EVar9 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>
                                              ::Object<(anonymous_namespace)::InheritedStruct>::
                                              operator()((
                                                  Object<(anonymous_namespace)::InheritedStruct> *)
                                                  local_258,(InheritedStruct *)&local_318,
                                                  (Value *)&local_280);
                                      if (EVar9 == InvalidInt) {
                                        Json::Value::removeMember((Value *)&local_280,"field2");
                                        local_340 = &local_330;
                                        local_368._M_unused._M_object = &aStack_358;
                                        local_368._M_pod_data[8] = '\0';
                                        local_368._9_7_ = 0;
                                        aStack_358._M_local_buf[0] = '\0';
                                        local_338 = 0;
                                        local_330._M_local_buf[0] = '\0';
                                        EVar9 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>
                                                ::Object<(anonymous_namespace)::InheritedStruct>::
                                                operator()((
                                                  Object<(anonymous_namespace)::InheritedStruct> *)
                                                  local_258,(InheritedStruct *)&local_368,
                                                  (Value *)&local_280);
                                        if (EVar9 == InvalidObject) {
                                          Json::Value::Value((Value *)&local_120,2);
                                          pVVar11 = Json::Value::operator[]
                                                              ((Value *)&local_280,"field2");
                                          Json::Value::operator=(pVVar11,(Value *)&local_120);
                                          Json::Value::~Value((Value *)&local_120);
                                          Json::Value::Value((Value *)&local_120,3);
                                          pVVar11 = Json::Value::operator[]
                                                              ((Value *)&local_280,"field3");
                                          Json::Value::operator=(pVVar11,(Value *)&local_120);
                                          Json::Value::~Value((Value *)&local_120);
                                          local_120.string_ = &local_110;
                                          local_118 = (char *)0x0;
                                          local_110 = 0;
                                          local_f8 = &local_e8;
                                          local_f0 = 0;
                                          local_e8._M_local_buf[0] = '\0';
                                          EVar9 = cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>
                                                  ::Object<(anonymous_namespace)::InheritedStruct>::
                                                  operator()((
                                                  Object<(anonymous_namespace)::InheritedStruct> *)
                                                  local_258,(InheritedStruct *)&local_120,
                                                  (Value *)&local_280);
                                          if (EVar9 == InvalidString) {
                                            Json::Value::removeMember((Value *)&local_280,"field3");
                                            local_200._M_p = (pointer)&local_1f0;
                                            local_228._0_8_ = local_218;
                                            local_228._8_8_ = (char *)0x0;
                                            local_218._0_8_ = local_218._0_8_ & 0xffffffffffffff00;
                                            local_1f8 = 0;
                                            local_1f0._M_local_buf[0] = '\0';
                                            EVar9 = 
                                                  cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>
                                                  ::Object<(anonymous_namespace)::InheritedStruct>::
                                                  operator()((
                                                  Object<(anonymous_namespace)::InheritedStruct> *)
                                                  local_258,(InheritedStruct *)local_228,
                                                  (Value *)&local_280);
                                            if (EVar9 == InvalidObject) {
                                              Json::Value::Value((Value *)local_168,"Hello");
                                              Json::Value::operator=
                                                        ((Value *)&local_280,(Value *)local_168);
                                              Json::Value::~Value((Value *)local_168);
                                              local_168._0_8_ = &local_158;
                                              local_168._8_8_ = (char *)0x0;
                                              local_158._M_local_buf[0] = '\0';
                                              local_140._M_p = (pointer)&local_130;
                                              local_138 = 0;
                                              local_130._M_local_buf[0] = '\0';
                                              EVar9 = 
                                                  cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>
                                                  ::Object<(anonymous_namespace)::InheritedStruct>::
                                                  operator()((
                                                  Object<(anonymous_namespace)::InheritedStruct> *)
                                                  local_258,(InheritedStruct *)local_168,
                                                  (Value *)&local_280);
                                              if (EVar9 == InvalidObject) {
                                                local_d8.super_ObjectStruct.Field1._M_dataplus._M_p
                                                     = (pointer)&local_d8.super_ObjectStruct.Field1.
                                                                 field_2;
                                                local_d8.super_ObjectStruct.Field1._M_string_length
                                                     = 0;
                                                local_d8.super_ObjectStruct.Field1.field_2.
                                                _M_local_buf[0] = '\0';
                                                local_d8.Field3._M_dataplus._M_p =
                                                     (pointer)&local_d8.Field3.field_2;
                                                local_d8.Field3._M_string_length = 0;
                                                local_d8.Field3.field_2._M_local_buf[0] = '\0';
                                                EVar9 = 
                                                  cmJSONHelperBuilder<(anonymous_namespace)::ErrorCode>
                                                  ::Object<(anonymous_namespace)::InheritedStruct>::
                                                  operator()((
                                                  Object<(anonymous_namespace)::InheritedStruct> *)
                                                  local_258,&local_d8,(Value *)0x0);
                                                bVar7 = EVar9 == InvalidObject;
                                                if (!bVar7) {
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            ((ostream *)&std::cout,
                                                                                                                          
                                                  "ASSERT_TRUE(helper(s7, nullptr) == ErrorCode::InvalidObject) failed on line "
                                                  ,0x4c);
                                                  poVar10 = (ostream *)
                                                            std::ostream::operator<<
                                                                      (&std::cout,0xfa);
                                                  std::__ostream_insert<char,std::char_traits<char>>
                                                            (poVar10,"\n",1);
                                                }
                                                anon_unknown.dwarf_a9a5e::InheritedStruct::
                                                ~InheritedStruct(&local_d8);
                                              }
                                              else {
                                                std::__ostream_insert<char,std::char_traits<char>>
                                                          ((ostream *)&std::cout,
                                                                                                                      
                                                  "ASSERT_TRUE(helper(s6, &v) == ErrorCode::InvalidObject) failed on line "
                                                  ,0x47);
                                                poVar10 = (ostream *)
                                                          std::ostream::operator<<(&std::cout,0xf7);
                                                std::__ostream_insert<char,std::char_traits<char>>
                                                          (poVar10,"\n",1);
                                                bVar7 = false;
                                              }
                                              anon_unknown.dwarf_a9a5e::InheritedStruct::
                                              ~InheritedStruct((InheritedStruct *)local_168);
                                            }
                                            else {
                                              std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,
                                                                                                                  
                                                  "ASSERT_TRUE(helper(s5, &v) == ErrorCode::InvalidObject) failed on line "
                                                  ,0x47);
                                              poVar10 = (ostream *)
                                                        std::ostream::operator<<(&std::cout,0xf3);
                                              std::__ostream_insert<char,std::char_traits<char>>
                                                        (poVar10,"\n",1);
                                              bVar7 = false;
                                            }
                                            anon_unknown.dwarf_a9a5e::InheritedStruct::
                                            ~InheritedStruct((InheritedStruct *)local_228);
                                          }
                                          else {
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      ((ostream *)&std::cout,
                                                                                                              
                                                  "ASSERT_TRUE(helper(s4, &v) == ErrorCode::InvalidString) failed on line "
                                                  ,0x47);
                                            poVar10 = (ostream *)
                                                      std::ostream::operator<<(&std::cout,0xef);
                                            std::__ostream_insert<char,std::char_traits<char>>
                                                      (poVar10,"\n",1);
                                            bVar7 = false;
                                          }
                                          anon_unknown.dwarf_a9a5e::InheritedStruct::
                                          ~InheritedStruct((InheritedStruct *)&local_120);
                                        }
                                        else {
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    ((ostream *)&std::cout,
                                                                                                          
                                                  "ASSERT_TRUE(helper(s3, &v) == ErrorCode::InvalidObject) failed on line "
                                                  ,0x47);
                                          poVar10 = (ostream *)
                                                    std::ostream::operator<<(&std::cout,0xea);
                                          std::__ostream_insert<char,std::char_traits<char>>
                                                    (poVar10,"\n",1);
                                          bVar7 = false;
                                        }
                                        if (local_340 != &local_330) {
                                          operator_delete(local_340,
                                                          CONCAT71(local_330._M_allocated_capacity.
                                                                   _1_7_,local_330._M_local_buf[0])
                                                          + 1);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_368._M_unused._0_8_ != &aStack_358) {
                                          operator_delete(local_368._M_unused._M_object,
                                                          CONCAT71(aStack_358._M_allocated_capacity.
                                                                   _1_7_,aStack_358._M_local_buf[0])
                                                          + 1);
                                        }
                                      }
                                      else {
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&std::cout,
                                                                                                      
                                                  "ASSERT_TRUE(helper(s2, &v) == ErrorCode::InvalidInt) failed on line "
                                                  ,0x44);
                                        poVar10 = (ostream *)
                                                  std::ostream::operator<<(&std::cout,0xe6);
                                        std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar10,"\n",1);
                                        bVar7 = false;
                                      }
                                      if (local_2f0 != &local_2e0) {
                                        operator_delete(local_2f0,
                                                        CONCAT71(local_2e0._M_allocated_capacity.
                                                                 _1_7_,local_2e0._M_local_buf[0]) +
                                                        1);
                                      }
                                      if (local_318 != &uStack_308) {
                                        operator_delete(local_318.string_,
                                                        CONCAT71(uStack_307,uStack_308) + 1);
                                      }
                                      goto LAB_00176601;
                                    }
                                    iVar8 = 0xe2;
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,
                                               "ASSERT_TRUE(s1.Field3 == \"world!\") failed on line "
                                               ,0x32);
                                  }
                                  else {
                                    iVar8 = 0xe1;
                                    std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&std::cout,
                                               "ASSERT_TRUE(s1.Field2 == 2) failed on line ",0x2b);
                                  }
                                }
                                else {
                                  iVar8 = 0xe0;
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)&std::cout,
                                             "ASSERT_TRUE(s1.Field1 == \"Hello\") failed on line ",
                                             0x31);
                                }
                              }
                              else {
                                iVar8 = 0xdf;
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&std::cout,
                                           "ASSERT_TRUE(helper(s1, &v) == ErrorCode::Success) failed on line "
                                           ,0x41);
                              }
                              poVar10 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
                              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                              bVar7 = false;
LAB_00176601:
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_2a0._M_p != &local_290) {
                                operator_delete(local_2a0._M_p,
                                                CONCAT71(local_290._M_allocated_capacity._1_7_,
                                                         local_290._M_local_buf[0]) + 1);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_2c8._M_unused._0_8_ != &local_2b8) {
                                operator_delete(local_2c8._M_unused._M_object,
                                                local_2b8._M_allocated_capacity + 1);
                              }
                              Json::Value::~Value((Value *)&local_280);
                              uVar13 = local_258._8_8_;
                              if (local_258._0_8_ != local_258._8_8_) {
                                p_Var19 = (_Any_data *)(local_258._0_8_ + 0x10);
                                do {
                                  if (*(code **)(p_Var19 + 1) != (code *)0x0) {
                                    (**(code **)(p_Var19 + 1))(p_Var19,p_Var19,__destroy_functor);
                                  }
                                  lVar22 = (long)p_Var19 + 0x28;
                                  p_Var19 = (_Any_data *)(p_Var19->_M_pod_data + 0x38);
                                } while (lVar22 != uVar13);
                              }
                              if ((pointer)local_258._0_8_ != (pointer)0x0) {
                                operator_delete((void *)local_258._0_8_,
                                                local_258._16_8_ - local_258._0_8_);
                              }
                              if (!bVar7) {
                                return 1;
                              }
                              bVar7 = anon_unknown.dwarf_a9a5e::testObjectNoExtra();
                              if (!bVar7) {
                                return 1;
                              }
                              bVar7 = anon_unknown.dwarf_a9a5e::testObjectOptional();
                              if (!bVar7) {
                                return 1;
                              }
                              bVar7 = anon_unknown.dwarf_a9a5e::testVector();
                              if (!bVar7) {
                                return 1;
                              }
                              bVar7 = anon_unknown.dwarf_a9a5e::testVectorFilter();
                              if (!bVar7) {
                                return 1;
                              }
                              bVar7 = anon_unknown.dwarf_a9a5e::testMap();
                              if (!bVar7) {
                                return 1;
                              }
                              bVar7 = anon_unknown.dwarf_a9a5e::testMapFilter();
                              if (!bVar7) {
                                return 1;
                              }
                              bVar7 = anon_unknown.dwarf_a9a5e::testOptional();
                              if (!bVar7) {
                                return 1;
                              }
                              bVar7 = anon_unknown.dwarf_a9a5e::testRequired();
                              return (uint)!bVar7;
                            }
                            iVar8 = 0x80;
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,"ASSERT_TRUE(!b) failed on line ",0x1f)
                            ;
                          }
                          else {
                            iVar8 = 0x7f;
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,
                                       "ASSERT_TRUE(BoolHelper(b, nullptr) == ErrorCode::Success) failed on line "
                                       ,0x49);
                          }
                        }
                      }
                      else {
                        iVar8 = 0x77;
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   "ASSERT_TRUE(BoolHelper(b, &v) == ErrorCode::Success) failed on line "
                                   ,0x44);
                      }
                    }
                  }
                  else {
                    iVar8 = 0x72;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "ASSERT_TRUE(BoolHelper(b, &v) == ErrorCode::Success) failed on line "
                               ,0x44);
                  }
LAB_00175143:
                  poVar10 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
                  goto LAB_00174e3b;
                }
                iVar8 = 0x69;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"ASSERT_TRUE(i == 1) failed on line ",0x23);
              }
              else {
                iVar8 = 0x68;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "ASSERT_TRUE(UIntHelper(i, nullptr) == ErrorCode::Success) failed on line "
                           ,0x49);
              }
            }
            else {
              iVar8 = 0x61;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"ASSERT_TRUE(i == 2) failed on line ",0x23);
            }
          }
          else {
            iVar8 = 0x60;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "ASSERT_TRUE(UIntHelper(i, &v) == ErrorCode::Success) failed on line ",0x44);
          }
LAB_00174ff1:
          poVar10 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          goto LAB_00174e3b;
        }
        iVar8 = 0x57;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"ASSERT_TRUE(i == 1) failed on line ",0x23);
      }
      else {
        iVar8 = 0x56;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "ASSERT_TRUE(IntHelper(i, nullptr) == ErrorCode::Success) failed on line ",0x48);
      }
    }
    else {
      iVar8 = 0x4f;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(i == 2) failed on line ",0x23);
    }
  }
  else {
    iVar8 = 0x4e;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "ASSERT_TRUE(IntHelper(i, &v) == ErrorCode::Success) failed on line ",0x43);
  }
LAB_00174e19:
  poVar10 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
LAB_00174e3b:
  Json::Value::~Value((Value *)&local_2c8);
  return 1;
}

Assistant:

int testJSONHelpers(int /*unused*/, char* /*unused*/ [])
{
  if (!testInt()) {
    return 1;
  }
  if (!testUInt()) {
    return 1;
  }
  if (!testBool()) {
    return 1;
  }
  if (!testString()) {
    return 1;
  }
  if (!testObject()) {
    return 1;
  }
  if (!testObjectInherited()) {
    return 1;
  }
  if (!testObjectNoExtra()) {
    return 1;
  }
  if (!testObjectOptional()) {
    return 1;
  }
  if (!testVector()) {
    return 1;
  }
  if (!testVectorFilter()) {
    return 1;
  }
  if (!testMap()) {
    return 1;
  }
  if (!testMapFilter()) {
    return 1;
  }
  if (!testOptional()) {
    return 1;
  }
  if (!testRequired()) {
    return 1;
  }
  return 0;
}